

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int mg_get_var2(char *data,size_t data_len,char *name,char *dst,size_t dst_len,size_t occurrence)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  size_t len;
  char *pcVar4;
  char *src;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  
  iVar2 = -2;
  if (dst_len != 0 && dst != (char *)0x0) {
    if (((data_len == 0) || (data == (char *)0x0)) || (name == (char *)0x0)) {
      *dst = '\0';
      iVar2 = -1;
    }
    else {
      len = strlen(name);
      *dst = '\0';
      iVar2 = -1;
      if ((long)len < (long)data_len) {
        lVar6 = 0;
        do {
          if (((lVar6 == 0) || (data[lVar6 + -1] == '&')) &&
             ((data[lVar6 + len] == '=' &&
              ((iVar2 = mg_strncasecmp(name,data + lVar6,len), iVar2 == 0 &&
               (bVar7 = occurrence == 0, occurrence = occurrence - 1, bVar7)))))) {
            src = data + lVar6 + len + 1;
            pcVar4 = (char *)memchr(src,0x26,(~len + data_len) - lVar6);
            pcVar5 = data + data_len;
            if (pcVar4 != (char *)0x0) {
              pcVar5 = pcVar4;
            }
            if (pcVar5 < src) {
              return -3;
            }
            uVar3 = mg_url_decode(src,((int)pcVar5 + ~((int)data + (int)len)) - (int)lVar6,dst,
                                  (int)dst_len,1);
            if (uVar3 < 0xfffffffe) {
              return uVar3;
            }
            return -2;
          }
          iVar2 = -1;
          lVar1 = lVar6 + len;
          lVar6 = lVar6 + 1;
        } while (data + lVar1 + 1 < data + data_len);
      }
    }
  }
  return iVar2;
}

Assistant:

CIVETWEB_API int
mg_get_var2(const char *data,
            size_t data_len,
            const char *name,
            char *dst,
            size_t dst_len,
            size_t occurrence)
{
	const char *p, *e, *s;
	size_t name_len;
	int len;

	if ((dst == NULL) || (dst_len == 0)) {
		len = -2;
	} else if ((data == NULL) || (name == NULL) || (data_len == 0)) {
		len = -1;
		dst[0] = '\0';
	} else {
		name_len = strlen(name);
		e = data + data_len;
		len = -1;
		dst[0] = '\0';

		/* data is "var1=val1&var2=val2...". Find variable first */
		for (p = data; p + name_len < e; p++) {
			if (((p == data) || (p[-1] == '&')) && (p[name_len] == '=')
			    && !mg_strncasecmp(name, p, name_len) && 0 == occurrence--) {
				/* Point p to variable value */
				p += name_len + 1;

				/* Point s to the end of the value */
				s = (const char *)memchr(p, '&', (size_t)(e - p));
				if (s == NULL) {
					s = e;
				}
				DEBUG_ASSERT(s >= p);
				if (s < p) {
					return -3;
				}

				/* Decode variable into destination buffer */
				len = mg_url_decode(p, (int)(s - p), dst, (int)dst_len, 1);

				/* Redirect error code from -1 to -2 (destination buffer too
				 * small). */
				if (len == -1) {
					len = -2;
				}
				break;
			}
		}
	}

	return len;
}